

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

SignWithPrivkeyRequestStruct * __thiscall
cfd::js::api::json::SignWithPrivkeyRequest::ConvertToStruct
          (SignWithPrivkeyRequestStruct *__return_storage_ptr__,SignWithPrivkeyRequest *this)

{
  vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_> local_198;
  SignWithPrivkeyTxInRequestStruct local_180;
  undefined1 local_19;
  SignWithPrivkeyRequest *local_18;
  SignWithPrivkeyRequest *this_local;
  SignWithPrivkeyRequestStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (SignWithPrivkeyRequest *)__return_storage_ptr__;
  SignWithPrivkeyRequestStruct::SignWithPrivkeyRequestStruct(__return_storage_ptr__);
  __return_storage_ptr__->is_elements = (bool)(this->is_elements_ & 1);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->tx,(string *)&this->tx_);
  SignWithPrivkeyTxInRequest::ConvertToStruct(&local_180,&this->txin_);
  SignWithPrivkeyTxInRequestStruct::operator=(&__return_storage_ptr__->txin,&local_180);
  SignWithPrivkeyTxInRequestStruct::~SignWithPrivkeyTxInRequestStruct(&local_180);
  core::JsonObjectVector<cfd::js::api::json::UtxoObject,_cfd::js::api::UtxoObjectStruct>::
  ConvertToStruct(&local_198,&this->utxos_);
  std::vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>::
  operator=(&__return_storage_ptr__->utxos,&local_198);
  std::vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>::
  ~vector(&local_198);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

SignWithPrivkeyRequestStruct SignWithPrivkeyRequest::ConvertToStruct() const {  // NOLINT
  SignWithPrivkeyRequestStruct result;
  result.is_elements = is_elements_;
  result.tx = tx_;
  result.txin = txin_.ConvertToStruct();
  result.utxos = utxos_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}